

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.h
# Opt level: O2

double __thiscall
Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
          (CascadeStages<4,_Iir::DirectFormII> *this,double in)

{
  DirectFormII *this_00;
  long lVar1;
  
  this_00 = this->m_states;
  for (lVar1 = 0xc0; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    in = DirectFormII::filter(this_00,in,this->m_stages);
    this = (CascadeStages<4,_Iir::DirectFormII> *)(this->m_stages + 1);
    this_00 = this_00 + 1;
  }
  return in;
}

Assistant:

inline Sample filter(const Sample in)
        {
                double out = in;
                StateType* state = m_states;
                for (const auto &stage: m_stages)
                        out = (state++)->filter(out, stage);
                return static_cast<Sample> (out);
        }